

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall
ktx::ValidationContext::validateKTXmetalPixelFormat
          (ValidationContext *this,uint8_t *data,uint32_t size)

{
  int in_EDX;
  long in_RDI;
  VkFormat in_stack_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000058;
  IssueError *in_stack_00000060;
  ValidationContext *in_stack_00000068;
  string local_38 [36];
  int local_14;
  
  *(undefined1 *)(in_RDI + 0x115) = 1;
  local_14 = in_EDX;
  if (*(int *)(in_RDI + 0x44) != 0) {
    toString_abi_cxx11_(in_stack_00000034);
    error<std::__cxx11::string>(in_stack_00000068,in_stack_00000060,in_stack_00000058);
    std::__cxx11::string::~string(local_38);
  }
  if (local_14 != 4) {
    error<unsigned_int&>(in_stack_00000068,in_stack_00000060,(uint *)in_stack_00000058);
  }
  return;
}

Assistant:

void ValidationContext::validateKTXmetalPixelFormat(const uint8_t* data, uint32_t size) {
    (void) data;
    foundKTXmetalPixelFormat = true;

    if (header.vkFormat != VK_FORMAT_UNDEFINED)
        error(Metadata::KTXmetalPixelFormatWithVkFormat, toString(VkFormat(header.vkFormat)));

    if (size != 4)
        error(Metadata::KTXmetalPixelFormatInvalidSize, size);
}